

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O0

int arkRwtSet(N_Vector y,N_Vector weight,void *data)

{
  int iVar1;
  ARKodeMem in_RDX;
  N_Vector in_RDI;
  int flag;
  N_Vector My;
  ARKodeMem ark_mem;
  N_Vector My_00;
  uint local_4;
  
  local_4 = 0;
  if (in_RDX->rwt_is_ewt == 0) {
    My_00 = in_RDX->tempv1;
    if (in_RDX->step_mmult == (ARKMassMultFn)0x0) {
      N_VScale(0x3ff0000000000000,in_RDI,My_00);
    }
    else {
      iVar1 = (*in_RDX->step_mmult)(in_RDX,in_RDI,My_00);
      if (iVar1 != 0) {
        return -0x12;
      }
      local_4 = 0;
    }
    if (in_RDX->ritol == 0) {
      local_4 = arkRwtSetSS(in_RDX,My_00,(N_Vector)((ulong)local_4 << 0x20));
    }
    else if (in_RDX->ritol == 1) {
      local_4 = arkRwtSetSV(in_RDX,My_00,(N_Vector)CONCAT44(local_4,1));
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int arkRwtSet(N_Vector y, N_Vector weight, void* data)
{
  ARKodeMem ark_mem;
  N_Vector My;
  int flag = 0;

  /* data points to ark_mem here */
  ark_mem = (ARKodeMem)data;

  /* return if rwt is just ewt */
  if (ark_mem->rwt_is_ewt) { return (0); }

  /* put M*y into ark_tempv1 */
  My = ark_mem->tempv1;
  if (ark_mem->step_mmult != NULL)
  {
    flag = ark_mem->step_mmult((void*)ark_mem, y, My);
    if (flag != ARK_SUCCESS) { return (ARK_MASSMULT_FAIL); }
  }
  else
  { /* this condition should not apply, but just in case */
    N_VScale(ONE, y, My);
  }

  /* call appropriate routine to fill rwt */
  switch (ark_mem->ritol)
  {
  case ARK_SS: flag = arkRwtSetSS(ark_mem, My, weight); break;
  case ARK_SV: flag = arkRwtSetSV(ark_mem, My, weight); break;
  }

  return (flag);
}